

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

void sfd_tran_accept_cb(void *arg)

{
  nni_aio *aio;
  undefined2 uVar1;
  nni_aio *pnVar2;
  nng_err result;
  nng_stream *s;
  nni_iov local_40;
  undefined8 *local_30;
  sfd_tran_pipe *p;
  
  aio = (nni_aio *)((long)arg + 0xd0);
  nni_mtx_lock((nni_mtx *)arg);
  result = nni_aio_result(aio);
  if (result == NNG_OK) {
    s = (nng_stream *)nni_aio_get_output(aio,0);
    result = NNG_ECLOSED;
    if (*(char *)((long)arg + 0x3a) != '\0') {
LAB_0012591f:
      nng_stream_free(s);
      goto LAB_00125927;
    }
    result = nni_pipe_alloc_listener(&local_30,*(nni_listener **)((long)arg + 0x2c8));
    if (result != NNG_OK) goto LAB_0012591f;
    *local_30 = s;
    local_30[7] = arg;
    uVar1 = *(undefined2 *)((long)arg + 0x28);
    *(undefined2 *)((long)local_30 + 0x12) = uVar1;
    local_40.iov_buf = local_30 + 8;
    *(undefined1 *)(local_30 + 8) = 0;
    *(undefined1 *)((long)local_30 + 0x41) = 0x53;
    *(undefined1 *)((long)local_30 + 0x42) = 0x50;
    *(undefined1 *)((long)local_30 + 0x43) = 0;
    *(char *)((long)local_30 + 0x44) = (char)((ushort)uVar1 >> 8);
    *(char *)((long)local_30 + 0x45) = (char)uVar1;
    *(undefined1 *)((long)local_30 + 0x46) = 0;
    *(undefined1 *)((long)local_30 + 0x47) = 0;
    local_30[10] = 0;
    local_30[0xb] = 0;
    local_30[0xd] = 8;
    local_30[0xc] = 8;
    local_40.iov_len = 8;
    pnVar2 = (nni_aio *)(local_30 + 0x86);
    nni_aio_set_iov(pnVar2,1,&local_40);
    nni_list_append((nni_list *)((long)arg + 0x2b0),local_30);
    nni_aio_set_timeout(pnVar2,-1);
    nng_stream_send((nng_stream *)*local_30,pnVar2);
  }
  else {
LAB_00125927:
    pnVar2 = *(nni_aio **)((long)arg + 200);
    if (pnVar2 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 200) = 0;
      nni_aio_finish_error(pnVar2,result);
    }
    if ((result == NNG_ESTOPPED) || (*(char *)((long)arg + 0x3a) != '\0')) goto LAB_00125964;
  }
  nng_stream_listener_accept(*(nng_stream_listener **)((long)arg + 0x2d0),aio);
LAB_00125964:
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
sfd_tran_accept_cb(void *arg)
{
	sfd_tran_ep   *ep  = arg;
	nni_aio       *aio = &ep->connaio;
	sfd_tran_pipe *p;
	int            rv;
	nng_stream    *conn;

	nni_mtx_lock(&ep->mtx);

	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);
	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_pipe_alloc_listener((void **) &p, ep->nlistener)) != 0) {
		nng_stream_free(conn);
		goto error;
	}
	sfd_tran_pipe_start(p, conn, ep);
	nng_stream_listener_accept(ep->listener, &ep->connaio);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// When an error here occurs, let's send a notice up to the consumer.
	// That way it can be reported properly.
	if ((aio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	if (!ep->closed && rv != NNG_ESTOPPED) {
		nng_stream_listener_accept(ep->listener, &ep->connaio);
	}
	nni_mtx_unlock(&ep->mtx);
}